

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  size_t size;
  ulong size_00;
  ThreadSafeArena *this_00;
  void *pvVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  uint *__dest;
  Rep *__src;
  long lVar3;
  SizedPtr SVar4;
  LogMessage local_40;
  int local_2c;
  
  if (extend_amount < 1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x30,"extend_amount > 0");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  lVar3 = (long)this->capacity_proxy_ + 1;
  this_00 = &this->arena_->impl_;
  iVar2 = (int)lVar3;
  iVar2 = CalculateReserveSize<void*,8>(iVar2,extend_amount + iVar2);
  local_40.errno_saver_.saved_errno_ = -2;
  local_40._4_4_ = 0x1fffffff;
  local_2c = iVar2;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<int,unsigned_long>
                          (&local_2c,(unsigned_long *)&local_40,"new_capacity <= kMaxCapacity");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    size = (long)iVar2 * 8 + 8;
    if (this_00 == (ThreadSafeArena *)0x0) {
      SVar4 = AllocateAtLeast(size);
      __dest = (uint *)SVar4.p;
      iVar2 = (int)(SVar4.n + 0x7fffffff8 >> 3);
    }
    else {
      __dest = (uint *)Arena::CreateArray<char>((Arena *)this_00,size);
    }
    this->capacity_proxy_ = iVar2 + -1;
    pvVar1 = this->tagged_rep_or_elem_;
    if (((ulong)pvVar1 & 1) == 0) {
      *__dest = (uint)(pvVar1 != (void *)0x0);
      *(void **)(__dest + 2) = pvVar1;
    }
    else {
      __src = rep(this);
      memcpy(__dest,__src,(long)__src->allocated_size * 8 + 8);
      size_00 = lVar3 * 8 + 8;
      if (this_00 == (ThreadSafeArena *)0x0) {
        operator_delete(__src,size_00);
      }
      else {
        ThreadSafeArena::ReturnArrayMemory(this_00,__src,size_00);
      }
    }
    this->tagged_rep_or_elem_ = (char *)((long)__dest + 1);
    return (void **)(__dest + (long)this->current_size_ * 2 + 2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,0x3a,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_40,
             (char (*) [62])"New capacity is too large to fit into internal representation");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  ABSL_DCHECK(extend_amount > 0);
  constexpr size_t kPtrSize = sizeof(rep()->elements[0]);
  constexpr size_t kMaxSize = std::numeric_limits<size_t>::max();
  constexpr size_t kMaxCapacity = (kMaxSize - kRepHeaderSize) / kPtrSize;
  const int old_capacity = Capacity();
  Arena* arena = GetArena();
  Rep* new_rep = nullptr;
  {
    int new_capacity = internal::CalculateReserveSize<void*, kRepHeaderSize>(
        old_capacity, old_capacity + extend_amount);
    ABSL_DCHECK_LE(new_capacity, kMaxCapacity)
        << "New capacity is too large to fit into internal representation";
    const size_t new_size = kRepHeaderSize + kPtrSize * new_capacity;
    if (arena == nullptr) {
      const internal::SizedPtr alloc = internal::AllocateAtLeast(new_size);
      new_capacity = static_cast<int>((alloc.n - kRepHeaderSize) / kPtrSize);
      new_rep = reinterpret_cast<Rep*>(alloc.p);
    } else {
      auto* alloc = Arena::CreateArray<char>(arena, new_size);
      new_rep = reinterpret_cast<Rep*>(alloc);
    }
    capacity_proxy_ = new_capacity - kSSOCapacity;
  }

  if (using_sso()) {
    new_rep->allocated_size = tagged_rep_or_elem_ != nullptr ? 1 : 0;
    new_rep->elements[0] = tagged_rep_or_elem_;
  } else {
    Rep* old_rep = rep();
    memcpy(new_rep, old_rep,
           old_rep->allocated_size * kPtrSize + kRepHeaderSize);
    size_t old_size = old_capacity * kPtrSize + kRepHeaderSize;
    if (arena == nullptr) {
      internal::SizedDelete(old_rep, old_size);
    } else {
      arena->ReturnArrayMemory(old_rep, old_size);
    }
  }

  tagged_rep_or_elem_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(new_rep) + 1);

  return &new_rep->elements[current_size_];
}